

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.cpp
# Opt level: O1

optional<int> __thiscall rtb::Concurrency::Queue<int>::pop(Queue<int> *this)

{
  size_t *psVar1;
  _Optional_base<int,_true,_true> _Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  pthread_t pVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  unique_lock<std::mutex> mlock;
  key_type local_48;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->mutex_;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  pVar5 = pthread_self();
  while( true ) {
    local_48._M_thread = pVar5;
    pmVar6 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->subscribersMissingRead_,&local_48);
    if (*pmVar6 != 0) break;
    std::condition_variable::wait((unique_lock *)&this->cond_);
  }
  local_48._M_thread = pVar5;
  pmVar7 = std::
           map<std::thread::id,_std::_List_iterator<std::optional<int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
           ::operator[](&this->subscribersNextRead_,&local_48);
  _Var2._M_payload.super__Optional_payload_base<int> =
       (_Optional_payload<int,_true,_true,_true>)pmVar7->_M_node[1]._M_next;
  local_48._M_thread = pVar5;
  pmVar7 = std::
           map<std::thread::id,_std::_List_iterator<std::optional<int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
           ::operator[](&this->subscribersNextRead_,&local_48);
  pmVar7->_M_node = pmVar7->_M_node->_M_next;
  local_48._M_thread = pVar5;
  pmVar6 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&this->subscribersMissingRead_,&local_48);
  *pmVar6 = *pmVar6 + -1;
  bVar4 = someoneSlowerThanMe(this);
  if (!bVar4) {
    p_Var3 = (this->queue_).
             super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    psVar1 = &(this->queue_).
              super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x18);
  }
  std::unique_lock<std::mutex>::unlock(&local_40);
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return (_Optional_base<int,_true,_true>)
         (_Optional_base<int,_true,_true>)_Var2._M_payload.super__Optional_payload_base<int>;
}

Assistant:

std::optional<T> Queue<T>::pop() {
        std::unique_lock<std::mutex> mlock(mutex_);
        while (subscribersMissingRead_[std::this_thread::get_id()] == 0) {
            cond_.wait(mlock);
        }
        auto val{ *subscribersNextRead_[std::this_thread::get_id()] };
        // advance iterator (maybe goes to .end())
        subscribersNextRead_[std::this_thread::get_id()]++;
        subscribersMissingRead_[std::this_thread::get_id()]--;

        if (!someoneSlowerThanMe()) { queue_.pop_front(); }

        mlock.unlock();
        return val;
    }